

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::EmitProgram(ByteCodeGenerator *this,ParseNodeProg *pnodeProg)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this->isBinding = false;
  this->trackEnvDepth = true;
  AssignPropertyIds(this,((pnodeProg->super_ParseNodeFnc).funcInfo)->byteCodeFunction);
  Js::ByteCodeWriter::InitData(&this->m_writer,this->alloc,this->maxAstSize / 4);
  if ((pnodeProg->super_ParseNodeFnc).super_ParseNode.nop != knopProg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xa15,"(pnodeProg && pnodeProg->nop == knopProg)",
                       "pnodeProg && pnodeProg->nop == knopProg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->parentScopeInfo != (ScopeInfo *)0x0) {
    pnodeProg = (ParseNodeProg *)(pnodeProg->super_ParseNodeFnc).pnodeScopes;
  }
  EmitScopeList(this,(ParseNode *)pnodeProg,(ParseNode *)0x0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitProgram(ParseNodeProg *pnodeProg)
{
    // Indicate that the binding phase is over.
    this->isBinding = false;
    this->trackEnvDepth = true;
    AssignPropertyIds(pnodeProg->funcInfo->byteCodeFunction);

    int32 initSize = this->maxAstSize / AstBytecodeRatioEstimate;

    // Use the temp allocator in bytecode write temp buffer.
    m_writer.InitData(this->alloc, initSize);

#ifdef LOG_BYTECODE_AST_RATIO
    // log the max Ast size
    Output::Print(_u("Max Ast size: %d"), initSize);
#endif

    Assert(pnodeProg && pnodeProg->nop == knopProg);

    if (this->parentScopeInfo)
    {
        // Scope stack is already set up the way we want it, so don't visit the global scope.
        // Start emitting with the nested scope (i.e., the deferred function).
        this->EmitScopeList(pnodeProg->pnodeScopes);
    }
    else
    {
        this->EmitScopeList(pnodeProg);
    }
}